

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_simple
                   (char_t *s,char_t end_quote)

{
  size_t sVar1;
  byte *pbVar2;
  byte bVar3;
  byte *s_00;
  gap g;
  gap local_38;
  
  local_38.end = (char_t *)0x0;
  local_38.size = 0;
  do {
    do {
      s_00 = (byte *)s;
      sVar1 = local_38.size;
      bVar3 = *s_00;
      if (((anonymous_namespace)::chartype_table[bVar3] & 2) != 0) goto LAB_001289f9;
      bVar3 = s_00[1];
      if (((anonymous_namespace)::chartype_table[bVar3] & 2) != 0) {
        s_00 = s_00 + 1;
        goto LAB_001289f9;
      }
      bVar3 = s_00[2];
      if (((anonymous_namespace)::chartype_table[bVar3] & 2) != 0) {
        s_00 = s_00 + 2;
        goto LAB_001289f9;
      }
      bVar3 = s_00[3];
      s = (char_t *)(s_00 + 4);
    } while (((anonymous_namespace)::chartype_table[bVar3] & 2) == 0);
    s_00 = s_00 + 3;
LAB_001289f9:
    if (bVar3 == end_quote) {
      pbVar2 = s_00;
      if (local_38.end != (char_t *)0x0) {
        memmove(local_38.end + -local_38.size,local_38.end,(long)s_00 - (long)local_38.end);
        pbVar2 = s_00 + -sVar1;
      }
      *pbVar2 = 0;
      return (char_t *)(s_00 + 1);
    }
    if (bVar3 == 0x26) {
      s = strconv_escape((char_t *)s_00,&local_38);
    }
    else {
      if (bVar3 == 0) {
        return (char_t *)0x0;
      }
      s = (char_t *)(s_00 + 1);
    }
  } while( true );
}

Assistant:

static char_t* parse_simple(char_t* s, char_t end_quote)
		{
			gap g;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_attr));

				if (*s == end_quote)
				{
					*g.flush(s) = 0;

					return s + 1;
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return NULL;
				}
				else ++s;
			}
		}